

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilist.h
# Opt level: O2

uint32_t __thiscall spvtools::opt::BasicBlock::MergeBlockIdIfAny(BasicBlock *this)

{
  Instruction *pIVar1;
  uint32_t uVar2;
  
  pIVar1 = (this->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
  if ((pIVar1 != (this->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_) &&
     (pIVar1 = (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_,
     (pIVar1->opcode_ & ~OpUndef) == OpLoopMerge)) {
    uVar2 = Instruction::GetSingleWordInOperand(pIVar1,0);
    return uVar2;
  }
  return 0;
}

Assistant:

iterator_template& operator--() {
      node_ = node_->previous_node_;
      return *this;
    }